

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Namespace *n)

{
  bool bVar1;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this_00;
  Function *pFVar2;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *this_01;
  pool_ref *ppVar3;
  StructDeclaration *pSVar4;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *this_02;
  UsingDeclaration *pUVar5;
  ArrayView<soul::pool_ref<soul::AST::Function>_> local_98;
  pool_ref *local_88;
  pool_ref<soul::AST::UsingDeclaration> *u;
  iterator __end2_2;
  iterator __begin2_2;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *__range2_2;
  pool_ref<soul::AST::StructDeclaration> *s;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::AST::Function> *f;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range2;
  Namespace *local_18;
  Namespace *n_local;
  HEARTGenerator *this_local;
  
  local_18 = n;
  n_local = (Namespace *)this;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>>
            ((ArrayView<soul::pool_ref<soul::AST::StructDeclaration>> *)&__range2,
             &(n->super_ModuleBase).structures);
  generateStructs(this,___range2);
  this_00 = &local_18->functions;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ::begin(this_00);
  f = (pool_ref<soul::AST::Function> *)
      std::
      vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                                *)&f);
    if (!bVar1) break;
    ppVar3 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
             ::operator*(&__end2);
    pFVar2 = pool_ref::operator_cast_to_Function_(ppVar3);
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[5])(this,pFVar2);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
    ::operator++(&__end2);
  }
  this_01 = &(local_18->super_ModuleBase).structures;
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
             ::begin(this_01);
  s = (pool_ref<soul::AST::StructDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
      ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
                        *)&s);
    if (!bVar1) break;
    ppVar3 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
             ::operator*(&__end2_1);
    pSVar4 = pool_ref::operator_cast_to_StructDeclaration_(ppVar3);
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,pSVar4);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
    ::operator++(&__end2_1);
  }
  this_02 = &(local_18->super_ModuleBase).usings;
  __end2_2 = std::
             vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             ::begin(this_02);
  u = (pool_ref<soul::AST::UsingDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
      ::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
                        *)&u);
    if (!bVar1) break;
    local_88 = (pool_ref *)
               __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
               ::operator*(&__end2_2);
    pUVar5 = pool_ref::operator_cast_to_UsingDeclaration_(local_88);
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,pUVar5);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
    ::operator++(&__end2_2);
  }
  ArrayView<soul::pool_ref<soul::AST::Function>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            ((ArrayView<soul::pool_ref<soul::AST::Function>> *)&local_98,&local_18->functions);
  generateFunctions(this,local_98);
  return;
}

Assistant:

void visit (AST::Namespace& n) override
    {
        generateStructs (n.structures);
        for (auto& f : n.functions)   visitObject (f);
        for (auto& s : n.structures)  visitObject (s);
        for (auto& u : n.usings)      visitObject (u);

        generateFunctions (n.functions);
    }